

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O0

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateLine(HtmlparserCppTest *this,string *expected_line)

{
  bool bVar1;
  int iVar2;
  int local_1c;
  string *psStack_18;
  int line;
  string *expected_line_local;
  HtmlparserCppTest *this_local;
  
  psStack_18 = expected_line;
  expected_line_local = (string *)this;
  bVar1 = safe_strto32(expected_line,&local_1c);
  if (!bVar1) {
    fprintf(_stderr,"Check failed: %s\n","safe_strto32(expected_line, &line)");
    exit(1);
  }
  iVar2 = HtmlParser::line_number(&this->parser_);
  if (local_1c != iVar2) {
    fprintf(_stderr,"Check failed: %s %s %s\n","line","==","parser_.line_number()");
    exit(1);
  }
  return;
}

Assistant:

void HtmlparserCppTest::ValidateLine(const string &expected_line) {
  int line;
  CHECK(safe_strto32(expected_line, &line));
  EXPECT_EQ(line, parser_.line_number())
      << "Unexpected line count at line " << parser_.line_number();
}